

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::Synth::render(Synth *this,float *stream,Bit32u len)

{
  if (this->opened == true) {
    (*this->renderer->_vptr_Renderer[3])();
    return;
  }
  if (len * 2 == 0 || stream == (float *)0x0) {
    return;
  }
  memset(stream,0,(ulong)(len * 2) << 2);
  return;
}

Assistant:

static inline void renderStereo(bool opened, Renderer *renderer, S *stream, Bit32u len) {
	if (opened) {
		renderer->render(stream, len);
	} else {
		Synth::muteSampleBuffer(stream, len << 1);
	}
}